

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

bool __thiscall
Assimp::X3DImporter::FindNodeElement
          (X3DImporter *this,string *pID,EType pType,CX3DImporter_NodeElement **pElement)

{
  size_t __n;
  bool bVar1;
  int iVar2;
  CX3DImporter_NodeElement *pCVar3;
  _List_node_base *p_Var4;
  
  pCVar3 = this->NodeElement_Cur;
  while( true ) {
    if (pCVar3 == (CX3DImporter_NodeElement *)0x0) {
      bVar1 = FindNodeElement_FromRoot(this,pID,pType,pElement);
      return bVar1;
    }
    if ((pCVar3->Type == ENET_Group) &&
       (*(char *)&pCVar3[1].Child.
                  super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
                  ._M_impl._M_node.super__List_node_base._M_prev != '\0')) break;
    pCVar3 = pCVar3->Parent;
  }
  if (((pCVar3->Type == pType) &&
      (__n = (pCVar3->ID)._M_string_length, __n == pID->_M_string_length)) &&
     ((__n == 0 ||
      (iVar2 = bcmp((pCVar3->ID)._M_dataplus._M_p,(pID->_M_dataplus)._M_p,__n), iVar2 == 0)))) {
    bVar1 = true;
    if (pElement != (CX3DImporter_NodeElement **)0x0) {
      *pElement = pCVar3;
    }
  }
  else {
    p_Var4 = (pCVar3->Child).
             super__List_base<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&pCVar3->Child) {
      bVar1 = false;
    }
    else {
      do {
        bVar1 = FindNodeElement_FromNode
                          (this,(CX3DImporter_NodeElement *)p_Var4[1]._M_next,pID,pType,pElement);
        if (bVar1) {
          return bVar1;
        }
        p_Var4 = p_Var4->_M_next;
      } while (p_Var4 != (_List_node_base *)&pCVar3->Child);
    }
  }
  return bVar1;
}

Assistant:

bool X3DImporter::FindNodeElement(const std::string& pID, const CX3DImporter_NodeElement::EType pType, CX3DImporter_NodeElement** pElement)
{
    CX3DImporter_NodeElement* tnd = NodeElement_Cur;// temporary pointer to node.
    bool static_search = false;// flag: true if searching in static node.

    // At first check if we have deal with static node. Go up through parent nodes and check flag.
    while(tnd != nullptr)
    {
		if(tnd->Type == CX3DImporter_NodeElement::ENET_Group)
		{
			if(((CX3DImporter_NodeElement_Group*)tnd)->Static)
			{
				static_search = true;// Flag found, stop walking up. Node with static flag will holded in tnd variable.
				break;
			}
		}

		tnd = tnd->Parent;// go up in graph.
    }// while(tnd != nullptr)

    // at now call appropriate search function.
    if ( static_search )
    {
        return FindNodeElement_FromNode( tnd, pID, pType, pElement );
    }
    else
    {
        return FindNodeElement_FromRoot( pID, pType, pElement );
    }
}